

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ddict.c
# Opt level: O0

ZSTD_DDict *
ZSTD_createDDict_advanced
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_customMem customMem)

{
  uint uVar1;
  size_t code;
  size_t initResult;
  ZSTD_DDict *ddict;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  
  if ((customMem.customAlloc == (ZSTD_allocFunction)0x0) ==
      (customMem.customFree == (ZSTD_freeFunction)0x0)) {
    dict_local = ZSTD_customMalloc(0x6ad8,customMem);
    if ((ZSTD_DDict *)dict_local == (ZSTD_DDict *)0x0) {
      dict_local = (void *)0x0;
    }
    else {
      (((ZSTD_DDict *)dict_local)->cMem).customAlloc = customMem.customAlloc;
      (((ZSTD_DDict *)dict_local)->cMem).customFree = customMem.customFree;
      (((ZSTD_DDict *)dict_local)->cMem).opaque = customMem.opaque;
      code = ZSTD_initDDict_internal
                       ((ZSTD_DDict *)dict_local,dict,dictSize,dictLoadMethod,dictContentType);
      uVar1 = ERR_isError(code);
      if (uVar1 != 0) {
        ZSTD_freeDDict((ZSTD_DDict *)dict_local);
        dict_local = (void *)0x0;
      }
    }
  }
  else {
    dict_local = (void *)0x0;
  }
  return (ZSTD_DDict *)dict_local;
}

Assistant:

ZSTD_DDict* ZSTD_createDDict_advanced(const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_customMem customMem)
{
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;

    {   ZSTD_DDict* const ddict = (ZSTD_DDict*) ZSTD_customMalloc(sizeof(ZSTD_DDict), customMem);
        if (ddict == NULL) return NULL;
        ddict->cMem = customMem;
        {   size_t const initResult = ZSTD_initDDict_internal(ddict,
                                            dict, dictSize,
                                            dictLoadMethod, dictContentType);
            if (ZSTD_isError(initResult)) {
                ZSTD_freeDDict(ddict);
                return NULL;
        }   }
        return ddict;
    }
}